

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

__pid_t __thiscall efsw::Thread::wait(Thread *this,void *__stat_loc)

{
  ThreadImpl *this_00;
  Thread *this_local;
  
  if ((this->mThreadImpl != (ThreadImpl *)0x0) &&
     (Platform::ThreadImpl::wait(this->mThreadImpl,__stat_loc),
     this->mThreadImpl != (ThreadImpl *)0x0)) {
    this_00 = this->mThreadImpl;
    if (this_00 != (ThreadImpl *)0x0) {
      Platform::ThreadImpl::~ThreadImpl(this_00);
      operator_delete(this_00);
    }
    this->mThreadImpl = (ThreadImpl *)0x0;
  }
  return (__pid_t)this;
}

Assistant:

void Thread::wait() {
	if ( mThreadImpl ) {
		mThreadImpl->wait();

		efSAFE_DELETE( mThreadImpl );
	}
}